

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandDumpEquiv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Io_FileType_t FileType;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  uint fVerbose;
  uint fByName;
  long lVar4;
  char *pcVar5;
  uint local_5c;
  Abc_Ntk_t *pNtks [2];
  char *local_48 [3];
  
  pNtks[0] = (Abc_Ntk_t *)0x0;
  pNtks[1] = (Abc_Ntk_t *)0x0;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fByName = 1;
  local_5c = 1000;
LAB_002324c0:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Cnvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) {
      if (globalUtilOptind + 3 == argc) {
        local_48[0] = argv[globalUtilOptind];
        local_48[1] = (argv + globalUtilOptind)[1];
        pcVar3 = argv[(long)globalUtilOptind + 2];
        lVar4 = 0;
        while( true ) {
          if (lVar4 == 2) {
            Abc_NtkDumpEquiv(pNtks,pcVar3,local_5c,fByName,fVerbose);
            Abc_NtkDelete(pNtks[0]);
            Abc_NtkDelete(pNtks[1]);
            return 0;
          }
          pcVar5 = local_48[lVar4];
          FileType = Io_ReadFileType(pcVar5);
          pNtk = Io_Read(pcVar5,FileType,1,0);
          pNtks[lVar4] = pNtk;
          if (pNtk == (Abc_Ntk_t *)0x0) break;
          Abc_NtkToAig(pNtk);
          lVar4 = lVar4 + 1;
        }
      }
      else {
        pcVar3 = "Expecting three file names on the command line.\n";
LAB_00232589:
        Abc_Print(-1,pcVar3);
      }
      goto LAB_002325cf;
    }
    if (iVar2 == 0x6e) {
      fByName = fByName ^ 1;
      goto LAB_002324c0;
    }
    if (iVar2 != 0x43) goto LAB_002325cf;
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_00232589;
    }
    local_5c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
    if ((int)local_5c < 0) {
LAB_002325cf:
      Abc_Print(-2,
                "usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n"
               );
      Abc_Print(-2,"\t          computes equivalence classes of nodes in <file1> and <file2>\n");
      Abc_Print(-2,
                "\t          By default this procedure performs matching of primary inputs by name.\n"
               );
      Abc_Print(-2,
                "\t          Those inputs that cannot be matched are treated as free variables.\n");
      Abc_Print(-2,
                "\t          There is no effort to match primary outputs. Indeed, if two outputs\n")
      ;
      Abc_Print(-2,
                "\t          are equivalent, they will belong to the same equivalence class in the end.\n"
               );
      Abc_Print(-2,"\t-C num  : the maximum number of conflicts at each node [default = %d]\n",
                (ulong)local_5c);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (fByName == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-n      : enable matching of primary inputs by name [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v      : prints verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      Abc_Print(-2,"\t<file1> : first network whose nodes are considered\n");
      Abc_Print(-2,"\t<file2> : second network whose nodes are considered\n");
      Abc_Print(-2,"\t<file_dump_equiv> : text file with node equivalence classes\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDumpEquiv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpEquiv( Abc_Ntk_t * pNtks[2], char * pFileName, int nConfs, int fByName, int fVerbose );
    Abc_Ntk_t * pNtks[2] = {NULL};
    char * pFileName[2], * pFileNameOut;
    int c, nConfs = 1000, fByName = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'n':
            fByName ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 3 )
    {
        Abc_Print( -1, "Expecting three file names on the command line.\n" );
        goto usage;
    }
    pFileName[0] = argv[globalUtilOptind];
    pFileName[1] = argv[globalUtilOptind+1];
    pFileNameOut = argv[globalUtilOptind+2];
    for ( c = 0; c < 2; c++ )
    {
        pNtks[c] = Io_Read( pFileName[c], Io_ReadFileType(pFileName[c]), 1, 0 );
        if ( pNtks[c] == NULL )
            goto usage;
        Abc_NtkToAig( pNtks[c] );
    }
//    if ( Abc_NtkCiNum(pNtks[0]) != Abc_NtkCiNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary inputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else if ( Abc_NtkCoNum(pNtks[0]) != Abc_NtkCoNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary outputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else
        Abc_NtkDumpEquiv( pNtks, pFileNameOut, nConfs, fByName, fVerbose );
    Abc_NtkDelete( pNtks[0] );
    Abc_NtkDelete( pNtks[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n" );
    Abc_Print( -2, "\t          computes equivalence classes of nodes in <file1> and <file2>\n" );
    Abc_Print( -2, "\t          By default this procedure performs matching of primary inputs by name.\n" );
    Abc_Print( -2, "\t          Those inputs that cannot be matched are treated as free variables.\n" );
    Abc_Print( -2, "\t          There is no effort to match primary outputs. Indeed, if two outputs\n" );
    Abc_Print( -2, "\t          are equivalent, they will belong to the same equivalence class in the end.\n" );
    Abc_Print( -2, "\t-C num  : the maximum number of conflicts at each node [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-n      : enable matching of primary inputs by name [default = %s]\n", fByName? "yes": "no" );
    Abc_Print( -2, "\t-v      : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file1> : first network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file2> : second network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file_dump_equiv> : text file with node equivalence classes\n" );
    return 1;
}